

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

uint64 __thiscall google::protobuf::internal::ArenaImpl::FreeBlocks(ArenaImpl *this)

{
  Block **ppBVar1;
  Block *pBVar2;
  _func_void_void_ptr_size_t *p_Var3;
  Block *pBVar4;
  size_t sVar5;
  __pointer_type pSVar6;
  Block *pBVar7;
  long lVar8;
  uint64 uVar9;
  
  pSVar6 = (this->threads_)._M_b._M_p;
  uVar9 = 0;
  while (pSVar6 != (__pointer_type)0x0) {
    ppBVar1 = &pSVar6->head_;
    pSVar6 = pSVar6->next_;
    if (*ppBVar1 == (Block *)0x0) {
      lVar8 = 0;
    }
    else {
      pBVar2 = this->initial_block_;
      p_Var3 = (this->options_).block_dealloc;
      lVar8 = 0;
      pBVar7 = *ppBVar1;
      do {
        pBVar4 = pBVar7->next_;
        sVar5 = pBVar7->size_;
        if (pBVar7 != pBVar2) {
          (*p_Var3)(pBVar7,sVar5);
        }
        lVar8 = lVar8 + sVar5;
        pBVar7 = pBVar4;
      } while (pBVar4 != (Block *)0x0);
    }
    uVar9 = uVar9 + lVar8;
  }
  return uVar9;
}

Assistant:

uint64 ArenaImpl::FreeBlocks() {
  uint64 space_allocated = 0;
  // By omitting an Acquire barrier we ensure that any user code that doesn't
  // properly synchronize Reset() or the destructor will throw a TSAN warning.
  SerialArena* serial = threads_.load(std::memory_order_relaxed);

  while (serial) {
    // This is inside a block we are freeing, so we need to read it now.
    SerialArena* next = serial->next();
    space_allocated += ArenaImpl::SerialArena::Free(serial, initial_block_,
                                                    options_.block_dealloc);
    // serial is dead now.
    serial = next;
  }

  return space_allocated;
}